

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_list.h
# Opt level: O0

void __thiscall re2c::free_list<re2c::RegExp_*>::clear(free_list<re2c::RegExp_*> *this)

{
  bool bVar1;
  reference ppRVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  free_list<re2c::RegExp_*> *this_local;
  
  this->in_clear = true;
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::set<re2c::RegExp_*,_std::less<re2c::RegExp_*>,_std::allocator<re2c::RegExp_*>_>::begin
                 (&this->
                   super_set<re2c::RegExp_*,_std::less<re2c::RegExp_*>,_std::allocator<re2c::RegExp_*>_>
                 );
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::set<re2c::RegExp_*,_std::less<re2c::RegExp_*>,_std::allocator<re2c::RegExp_*>_>::end
                   (&this->
                     super_set<re2c::RegExp_*,_std::less<re2c::RegExp_*>,_std::allocator<re2c::RegExp_*>_>
                   );
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppRVar2 = std::_Rb_tree_const_iterator<re2c::RegExp_*>::operator*(&local_18);
    if (*ppRVar2 != (RegExp *)0x0) {
      (*(*ppRVar2)->_vptr_RegExp[1])();
    }
    std::_Rb_tree_const_iterator<re2c::RegExp_*>::operator++(&local_18);
  }
  std::set<re2c::RegExp_*,_std::less<re2c::RegExp_*>,_std::allocator<re2c::RegExp_*>_>::clear
            (&this->
              super_set<re2c::RegExp_*,_std::less<re2c::RegExp_*>,_std::allocator<re2c::RegExp_*>_>)
  ;
  this->in_clear = false;
  return;
}

Assistant:

void clear()
	{
		in_clear = true;

		for(iterator it = this->begin(); it != this->end(); ++it)
		{
			delete *it;
		}
		std::set<_Ty>::clear();
		
		in_clear = false;
	}